

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O2

void __thiscall duckdb::Relation::Head(Relation *this,idx_t limit)

{
  long offset;
  pointer this_00;
  pointer *__ptr;
  shared_ptr<duckdb::Relation,_true> limit_node;
  undefined1 local_28 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  offset = NumericCastImpl<long,_unsigned_long,_false>::Convert(limit);
  Limit((Relation *)(local_28 + 8),(int64_t)this,offset);
  shared_ptr<duckdb::Relation,_true>::operator->
            ((shared_ptr<duckdb::Relation,_true> *)(local_28 + 8));
  Execute((Relation *)local_28);
  this_00 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
            operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                        *)local_28);
  QueryResult::Print(this_00);
  if ((QueryResult *)local_28._0_8_ != (QueryResult *)0x0) {
    (*((BaseQueryResult *)local_28._0_8_)->_vptr_BaseQueryResult[1])();
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

void Relation::Head(idx_t limit) {
	auto limit_node = Limit(NumericCast<int64_t>(limit));
	limit_node->Execute()->Print();
}